

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::InvokeDefaultDelegate(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest)

{
  SQObjectType SVar1;
  bool bVar2;
  long lVar3;
  
  SVar1 = (self->super_SQObject)._type;
  if ((int)SVar1 < 0x8000400) {
    if ((int)SVar1 < 0x8000010) {
      if (((SVar1 != OT_BOOL) && (SVar1 != OT_INTEGER)) && (SVar1 != OT_FLOAT)) {
        return false;
      }
      lVar3 = 0xe8;
    }
    else if ((int)SVar1 < 0x8000100) {
      if (SVar1 == OT_STRING) {
        lVar3 = 0xd8;
      }
      else {
        if (SVar1 != OT_ARRAY) {
          return false;
        }
        lVar3 = 200;
      }
    }
    else {
      if ((SVar1 != OT_CLOSURE) && (SVar1 != OT_NATIVECLOSURE)) {
        return false;
      }
      lVar3 = 0x108;
    }
  }
  else if ((int)SVar1 < 0x8010000) {
    if (SVar1 == OT_GENERATOR) {
      lVar3 = 0xf8;
    }
    else if (SVar1 == OT_THREAD) {
      lVar3 = 0x118;
    }
    else {
      lVar3 = 0x128;
      if (SVar1 != OT_CLASS) {
        return false;
      }
    }
  }
  else if ((int)SVar1 < 0xa000080) {
    if (SVar1 == OT_WEAKREF) {
      lVar3 = 0x148;
    }
    else {
      if (SVar1 != OT_TABLE) {
        return false;
      }
      lVar3 = 0xb8;
    }
  }
  else if (SVar1 == OT_USERDATA) {
    lVar3 = 0x158;
  }
  else {
    if (SVar1 != OT_INSTANCE) {
      return false;
    }
    lVar3 = 0x138;
  }
  bVar2 = SQTable::Get(*(SQTable **)((long)&this->_sharedstate->_alloc_ctx + lVar3),key,dest);
  return bVar2;
}

Assistant:

bool SQVM::InvokeDefaultDelegate(const SQObjectPtr &self,const SQObjectPtr &key,SQObjectPtr &dest)
{
    SQTable *ddel = NULL;
    switch(sq_type(self)) {
        case OT_CLASS: ddel = _class_ddel; break;
        case OT_TABLE: ddel = _table_ddel; break;
        case OT_ARRAY: ddel = _array_ddel; break;
        case OT_STRING: ddel = _string_ddel; break;
        case OT_INSTANCE: ddel = _instance_ddel; break;
        case OT_INTEGER:case OT_FLOAT:case OT_BOOL: ddel = _number_ddel; break;
        case OT_GENERATOR: ddel = _generator_ddel; break;
        case OT_CLOSURE: case OT_NATIVECLOSURE: ddel = _closure_ddel; break;
        case OT_THREAD: ddel = _thread_ddel; break;
        case OT_WEAKREF: ddel = _weakref_ddel; break;
        case OT_USERDATA: ddel = _userdata_ddel; break;
        default: return false;
    }
    return  ddel->Get(key,dest);
}